

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sxmlsearch.c
# Opt level: O0

int XMLSearch_search_get_attribute_index(XMLSearch *search,SXML_CHAR *attr_name)

{
  int iVar1;
  int local_24;
  int i;
  SXML_CHAR *attr_name_local;
  XMLSearch *search_local;
  
  if (((search != (XMLSearch *)0x0) && (attr_name != (SXML_CHAR *)0x0)) && (*attr_name != '\0')) {
    for (local_24 = 0; local_24 < search->n_attributes; local_24 = local_24 + 1) {
      iVar1 = strcmp(search->attributes[local_24].name,attr_name);
      if (iVar1 == 0) {
        return local_24;
      }
    }
  }
  return -1;
}

Assistant:

int XMLSearch_search_get_attribute_index(const XMLSearch* search, const SXML_CHAR* attr_name)
{
	int i;

	if (search == NULL || attr_name == NULL || attr_name[0] == NULC)
		return -1;

	for (i = 0; i < search->n_attributes; i++) {
		if (!sx_strcmp(search->attributes[i].name, attr_name))
			return i;
	}

	return -1;
}